

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O3

int main(int narg,char **argv)

{
  element_type *peVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  pointer pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pbVar5;
  iterator __position;
  pointer pcVar6;
  pointer puVar7;
  element_type *peVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer pvVar12;
  pointer pvVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  long lVar17;
  int *piVar18;
  __node_base_ptr *pp_Var19;
  istream *piVar20;
  ostream *poVar21;
  pointer psVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  ulong uVar24;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  _Var25;
  const_iterator cVar26;
  result_type_conflict1 rVar27;
  pointer pvVar28;
  ulong uVar29;
  undefined8 uVar30;
  long *plVar31;
  size_t __i;
  element_type *peVar32;
  long *plVar33;
  pointer *ppsVar34;
  uint uVar35;
  pointer psVar36;
  pointer ppVar37;
  size_t i;
  ulong uVar38;
  long lVar39;
  size_t sVar40;
  element_type *peVar41;
  ulong uVar42;
  _Bit_pointer puVar43;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar44;
  element_type *peVar45;
  Covec<float> *pCVar46;
  pointer pvVar47;
  size_t count;
  __node_base_ptr *pp_Var48;
  unsigned_long uVar49;
  pointer pbVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  double dVar54;
  undefined1 auVar53 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar55;
  string line;
  vector<unsigned_long,_std::allocator<unsigned_long>_> instance;
  string output_file;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> share;
  vector<unsigned_long,_std::allocator<unsigned_long>_> instance_1;
  string input_file;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  codebooks;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  probs;
  size_t batch_size;
  string output_prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_code2entries;
  string share_str;
  Covec<float> cv;
  ifstream fin_1;
  mt19937 gen;
  _func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
  *local_1910;
  long local_1908;
  undefined1 local_1900;
  undefined7 uStack_18ff;
  size_t local_18f0;
  undefined1 local_18e8 [16];
  ulong local_18d0;
  element_type *local_18c8;
  undefined1 local_18c0 [32];
  vector<bool,_std::allocator<bool>_> local_18a0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1878;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1858;
  element_type *local_1840;
  vector<bool,_std::allocator<bool>_> local_1838;
  size_t local_1810;
  pointer local_1808;
  size_t local_1800;
  float local_17f4;
  float local_17f0;
  float local_17ec;
  char *local_17e8;
  long local_17e0;
  char local_17d8 [16];
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  local_17c8;
  vector<double,_std::allocator<double>_> local_17a8;
  reference_wrapper<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  local_1790;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_1788;
  size_t local_1780;
  undefined1 *local_1778;
  long local_1770;
  undefined1 local_1768 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1758;
  char *local_1740;
  ulong local_1738;
  char local_1730 [16];
  undefined1 local_1720 [32];
  size_t local_1700;
  size_t local_16f8;
  __node_base_ptr p_Stack_16f0;
  pointer local_16e8;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  local_16d0;
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  local_16b8;
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_16a0;
  pointer local_1688;
  undefined1 local_1670 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1668;
  element_type local_1660 [4];
  ios_base local_1578 [272];
  Config local_1468;
  undefined1 local_13b8 [32];
  int aiStack_1398 [1240];
  size_t local_38;
  
  anon_unknown.dwarf_21c2f::parse_args(&local_1468,narg,argv);
  local_1800 = local_1468.dim;
  local_1780 = local_1468.batch_size;
  local_18f0 = local_1468.num_epochs;
  local_1810 = local_1468.neg_size;
  local_18c8 = (element_type *)local_1468.num_threads;
  local_17ec = local_1468.sigma;
  local_17f0 = local_1468.eta0;
  local_17f4 = local_1468.eta1;
  local_17e8 = local_17d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_17e8,local_1468.input_file._M_dataplus._M_p,
             local_1468.input_file._M_dataplus._M_p + local_1468.input_file._M_string_length);
  local_1778 = local_1768;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1778,local_1468.output_prefix._M_dataplus._M_p,
             local_1468.output_prefix._M_dataplus._M_p + local_1468.output_prefix._M_string_length);
  local_1740 = local_1730;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1740,local_1468.share_str._M_dataplus._M_p,
             local_1468.share_str._M_dataplus._M_p + local_1468.share_str._M_string_length);
  local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  if (local_1738 != 0) {
    pp_Var48 = (__node_base_ptr *)0x0;
    do {
      lVar17 = std::__cxx11::string::find((char)&local_1740,0x2c);
      std::__cxx11::string::substr((ulong)local_13b8,(ulong)&local_1740);
      uVar30 = local_13b8._0_8_;
      piVar18 = __errno_location();
      iVar16 = *piVar18;
      *piVar18 = 0;
      pp_Var19 = (__node_base_ptr *)strtol((char *)uVar30,(char **)local_1670,10);
      if (local_1670 == (undefined1  [8])uVar30) {
        std::__throw_invalid_argument("stoi");
LAB_0010cf17:
        std::__throw_out_of_range("stoi");
        goto LAB_0010cf23;
      }
      if (((__node_base_ptr *)(long)(int)pp_Var19 != pp_Var19) || (*piVar18 == 0x22))
      goto LAB_0010cf17;
      if (*piVar18 == 0) {
        *piVar18 = iVar16;
      }
      if ((element_type *)local_13b8._0_8_ != (element_type *)(local_13b8 + 0x10)) {
        operator_delete((void *)local_13b8._0_8_);
      }
      local_1720._0_8_ = pp_Var19;
      if (pp_Var48 < pp_Var19) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "invalid share string (share string should be 0, 1, 2, ... in this order): ",0x4a
                  );
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_1740,local_1738);
        std::endl<char,std::char_traits<char>>(poVar21);
        goto LAB_0010ce76;
      }
      pp_Var48 = (__node_base_ptr *)((long)pp_Var48 + (ulong)(pp_Var48 <= pp_Var19));
      if (local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1858,
                   (iterator)
                   local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1720);
      }
      else {
        *local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)pp_Var19;
        local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    } while ((lVar17 != -1) && (lVar17 + 1U < local_1738));
  }
  std::ifstream::ifstream(local_13b8,(string *)&local_17e8,_S_in);
  pdVar4 = (((element_type *)(local_13b8._0_8_ + -0x30))->_M_param)._M_cp.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (*(int *)((long)aiStack_1398 + (long)pdVar4) == 0) {
    local_1670 = (undefined1  [8])local_1660;
    local_1668._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_1660[0]._M_param._M_prob.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    cVar15 = std::ios::widen((char)&stack0xffffffffffffe6c8 + (char)pdVar4 + -0x80);
    piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_13b8,(string *)local_1670,cVar15);
    if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) == 0) {
      iVar16 = std::__cxx11::string::compare(local_1670);
      if (iVar16 != 0) {
        uVar35 = (uint)local_1468.sep;
        lVar17 = std::__cxx11::string::find((char)local_1670,(ulong)uVar35);
        uVar42 = 1;
        if (lVar17 != -1) {
          do {
            uVar42 = uVar42 + 1;
            lVar17 = std::__cxx11::string::find((char)local_1670,(ulong)uVar35);
          } while (lVar17 != -1);
        }
        local_18d0 = CONCAT44(local_18d0._4_4_,uVar35);
        if (local_1670 != (undefined1  [8])local_1660) {
          operator_delete((void *)local_1670);
        }
        std::ifstream::~ifstream(local_13b8);
        local_18e8[0] = local_1468.sort_enabled;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"config:",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"dim          : ",0xf);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"batch_size   : ",0xf);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"num_epochs   : ",0xf);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"neg_size     : ",0xf);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"num_threads  : ",0xf);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sigma        : ",0xf);
        poVar21 = std::ostream::_M_insert<double>((double)local_17ec);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"eta0         : ",0xf);
        poVar21 = std::ostream::_M_insert<double>((double)local_17f0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"eta1         : ",0xf);
        poVar21 = std::ostream::_M_insert<double>((double)local_17f4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"input_file   : ",0xf);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_17e8,local_17e0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"output_vector_file  : ",0x16);
        local_13b8._0_8_ = local_13b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_13b8,local_1778,local_1778 + local_1770);
        std::__cxx11::string::append(local_13b8);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_13b8._0_8_,local_13b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        if ((undefined1 *)local_13b8._0_8_ != local_13b8 + 0x10) {
          operator_delete((void *)local_13b8._0_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sep          : ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
        local_13b8[0] = local_1468.sep;
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_13b8,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"share        : ",0xf);
        if (local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar38 = 0;
          do {
            if (uVar38 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            uVar38 = uVar38 + 1;
          } while (uVar38 < (ulong)((long)local_1858.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1858.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"order        : ",0xf);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"shuffle      : ",0xf);
        *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)
                 ) = *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                              *(long *)(std::cout + -0x18)) | 1;
        poVar21 = std::ostream::_M_insert<bool>(true);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sort         : ",0xf);
        *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)
                 ) = *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                              *(long *)(std::cout + -0x18)) | 1;
        poVar21 = std::ostream::_M_insert<bool>(true);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        local_17c8.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_17c8.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar38 = 0;
        local_17c8.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1878.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1878.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1878.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_13b8._0_8_ = (element_type *)0x0;
        lVar17 = 1;
        do {
          uVar38 = (ulong)(((uint)(uVar38 >> 0x1e) ^ (uint)uVar38) * 0x6c078965 + (int)lVar17);
          *(ulong *)(local_13b8 + lVar17 * 8) = uVar38;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x270);
        local_38 = 0x270;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"load ",5);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_17e8,local_17e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21," ...",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        if (uVar42 == 0) {
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_ =
               local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000
          ;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ =
               local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ &
               0xffffffff00000000;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        else {
          if (uVar42 >> 0x3b != 0) {
            std::__throw_length_error("vector::_M_default_append");
          }
          psVar22 = (pointer)operator_new(uVar42 * 0x10);
          uVar49 = 0;
          memset(psVar22,0,uVar42 * 0x10);
          local_17c8.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar22 + uVar42;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_ =
               (ulong)(uint)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ <<
               0x20;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ =
               (ulong)(uint)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ <<
               0x20;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
          uVar38 = 0;
          local_17c8.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_start = psVar22;
          local_17c8.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_17c8.
               super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if ((local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish) ||
               (local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start[uVar38] == uVar49)) {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_18a0,true);
              uVar49 = uVar49 + 1;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_18a0,false);
            }
            uVar38 = uVar38 + 1;
          } while (uVar42 != uVar38);
          this_00 = &(psVar22->
                     super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount;
          uVar38 = 0;
          do {
            uVar24 = uVar38 + 0x3f;
            if (-1 < (long)uVar38) {
              uVar24 = uVar38;
            }
            if ((*(ulong *)((long)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (((long)uVar24 >> 6) +
                           ((ulong)((uVar38 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8)
                 >> (uVar38 & 0x3f) & 1) == 0) {
              uVar49 = local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar38];
              ((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2> *)
              (this_00 + -1))->_M_ptr =
                   psVar22[uVar49].
                   super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (this_00,&psVar22[uVar49].
                                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
            }
            else {
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
              p_Var23->_M_use_count = 1;
              p_Var23->_M_weak_count = 1;
              p_Var23->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011abb8
              ;
              p_Var23[4]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var23[4]._M_use_count = 0;
              p_Var23[4]._M_weak_count = 0;
              p_Var23[1]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var23[1]._M_use_count = 0;
              p_Var23[1]._M_weak_count = 0;
              p_Var23[2]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var23[2]._M_use_count = 0;
              p_Var23[2]._M_weak_count = 0;
              p_Var23[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var23[3]._M_use_count = 0;
              p_Var23[3]._M_weak_count = 0;
              p_Var23[6]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var23[4]._vptr__Sp_counted_base = (_func_int **)(p_Var23 + 7);
              p_Var23[4]._M_use_count = 1;
              p_Var23[4]._M_weak_count = 0;
              p_Var23[5]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var23[5]._M_use_count = 0;
              p_Var23[5]._M_weak_count = 0;
              *(undefined4 *)&p_Var23[6]._vptr__Sp_counted_base = 0x3f800000;
              p_Var23[6]._M_use_count = 0;
              p_Var23[6]._M_weak_count = 0;
              p_Var23[7]._vptr__Sp_counted_base = (_func_int **)0x0;
              ((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2> *)
              (this_00 + -1))->_M_ptr = (element_type *)(p_Var23 + 1);
              this = this_00->_M_pi;
              this_00->_M_pi = p_Var23;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
            }
            uVar38 = uVar38 + 1;
            this_00 = this_00 + 2;
          } while (uVar42 != uVar38);
        }
        std::ifstream::ifstream(local_1670,local_17e8,_S_in);
        if (*(int *)((long)&local_1660[0]._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data +
                    (long)((((element_type *)((long)local_1670 + -0x30))->_M_param)._M_cp.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + 2)) == 0) {
          local_1910 = (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                        *)&local_1900;
          local_1908 = 0;
          local_1900 = (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                        )0x0;
          local_1840 = (element_type *)0x0;
          while( true ) {
            cVar15 = std::ios::widen((char)(((element_type *)((long)local_1670 + -0x30))->_M_param).
                                           _M_cp.super__Vector_base<double,_std::allocator<double>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                     (char)(istream *)local_1670);
            piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_1670,(string *)&local_1910,cVar15);
            if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18c0,uVar42,
                       (allocator_type *)local_1720);
            local_1840 = (element_type *)
                         ((long)&(local_1840->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + 1);
            uVar38 = 1;
            psVar22 = local_17c8.
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              uVar24 = std::__cxx11::string::find((char)&local_1910,local_18d0 & 0xffffffff);
              peVar41 = (psVar22->
                        super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              std::__cxx11::string::substr((ulong)&local_1838,(ulong)&local_1910);
              _Var25._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(peVar41->entry2codes_)._M_h,(key_type *)&local_1838);
              if (_Var25._M_cur == (__node_type *)0x0) {
                pbVar50 = (peVar41->code2entries_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pbVar5 = (peVar41->code2entries_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                local_1720._0_8_ = local_1720 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1720,
                           local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                           (pointer)((long)local_1838.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p +
                                    CONCAT44(local_1838.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._12_4_,
                                             local_1838.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_offset)));
                local_1700 = (long)pbVar5 - (long)pbVar50 >> 5;
                pVar55 = std::
                         _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         ::_M_emplace<std::pair<std::__cxx11::string,unsigned_long>>
                                   ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                     *)&peVar41->entry2codes_,local_1720);
                _Var25._M_cur =
                     (__node_type *)
                     pVar55.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                     ._M_cur;
                if ((undefined1 *)local_1720._0_8_ != local_1720 + 0x10) {
                  operator_delete((void *)local_1720._0_8_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&peVar41->code2entries_,(value_type *)&local_1838);
                local_1720._0_8_ = (__node_base_ptr *)0x0;
                __position._M_current =
                     (peVar41->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (peVar41->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&peVar41->counts_,__position,(double *)local_1720);
                }
                else {
                  *__position._M_current = 0.0;
                  (peVar41->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              lVar17 = *(long *)((long)&((_Var25._M_cur)->
                                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                        ._M_storage._M_storage + 0x20);
              pdVar4 = (peVar41->counts_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar4[lVar17] = pdVar4[lVar17] + 1.0;
              if ((_Bit_iterator *)
                  local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  &local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish) {
                operator_delete(local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              }
              *(long *)(local_18c0._0_8_ + uVar38 * 8 + -8) = lVar17;
              if (uVar42 < uVar38) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"too many entries in a line: ",0x1c);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_1910,local_1908);
                std::endl<char,std::char_traits<char>>(poVar21);
                goto LAB_0010ce76;
              }
              uVar38 = uVar38 + 1;
              psVar22 = psVar22 + 1;
            } while (uVar24 < 0xfffffffffffffffe);
            if ((local_18e8[0] != '\0') ||
               (std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::push_back(&local_1878,(value_type *)local_18c0),
               (Covec<float> *)local_18c0._0_8_ != (Covec<float> *)0x0)) {
              operator_delete((void *)local_18c0._0_8_);
            }
          }
          if (local_18e8[0] != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"reindex ...",0xb);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
            if (uVar42 != 0) {
              local_1808 = local_17c8.
                           super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              uVar38 = 0;
              local_18e8._0_8_ = 0x800000000000003f;
              do {
                uVar24 = uVar38 + 0x3f;
                if (-1 < (long)uVar38) {
                  uVar24 = uVar38;
                }
                if ((*(ulong *)((long)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p +
                               (((long)uVar24 >> 6) +
                               ((ulong)((uVar38 & local_18e8._0_8_) < 0x8000000000000001) - 1)) * 8)
                     >> (uVar38 & 0x3f) & 1) != 0) {
                  peVar41 = local_1808[uVar38].
                            super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  std::
                  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ::vector((vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                            *)local_18c0,
                           (long)(peVar41->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(peVar41->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1720)
                  ;
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_17a8,
                             (long)(peVar41->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(peVar41->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3,
                             (allocator_type *)local_1720);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_1758,
                           (long)(peVar41->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(peVar41->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1720)
                  ;
                  uVar30 = local_18c0._0_8_;
                  local_1720._0_8_ = &p_Stack_16f0;
                  local_1720._8_8_ = (pointer)0x1;
                  local_1720._16_8_ = (_Hash_node_base *)0x0;
                  local_1720._24_8_ = 0;
                  local_1700 = CONCAT44(local_1700._4_4_,0x3f800000);
                  local_16f8 = 0;
                  p_Stack_16f0 = (__node_base_ptr)0x0;
                  pdVar4 = (peVar41->counts_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar17 = (long)(peVar41->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar4;
                  if (lVar17 != 0) {
                    lVar17 = lVar17 >> 3;
                    ppsVar34 = &(((vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                   *)local_18c0._0_8_)->
                                super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                    psVar36 = (pointer)0x0;
                    do {
                      ((_Vector_impl_data *)(ppsVar34 + -1))->_M_start =
                           (pointer)pdVar4[(long)psVar36];
                      *ppsVar34 = psVar36;
                      psVar36 = (pointer)((long)&(psVar36->
                                                 super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr + 1);
                      ppsVar34 = ppsVar34 + 2;
                    } while ((pointer)(lVar17 + (ulong)(lVar17 == 0)) != psVar36);
                  }
                  pCVar46 = (Covec<float> *)CONCAT44(local_18c0._12_4_,local_18c0._8_4_);
                  if ((Covec<float> *)local_18c0._0_8_ != pCVar46) {
                    uVar24 = (long)pCVar46 - local_18c0._0_8_ >> 4;
                    lVar17 = 0x3f;
                    if (uVar24 != 0) {
                      for (; uVar24 >> lVar17 == 0; lVar17 = lVar17 + -1) {
                      }
                    }
                    std::
                    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<double,unsigned_long>>>>
                              (local_18c0._0_8_,pCVar46,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
                    std::
                    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<double,unsigned_long>>>>
                              (uVar30,pCVar46);
                    lVar17 = CONCAT44(local_18c0._12_4_,local_18c0._8_4_) - local_18c0._0_8_;
                    if (lVar17 != 0) {
                      lVar17 = lVar17 >> 4;
                      lVar39 = 8;
                      lVar44 = 0;
                      puVar43 = (_Bit_pointer)0x0;
                      do {
                        pbVar50 = (peVar41->code2entries_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                                  *(long *)((long)&(((
                                                  vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                                  *)local_18c0._0_8_)->
                                                  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                           lVar39);
                        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)puVar43] =
                             *(double *)(local_18c0._0_8_ + lVar39 + -8);
                        std::__cxx11::string::_M_assign
                                  ((string *)
                                   ((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)&(local_1758.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)->_M_impl).super__Vector_impl_data.
                                           _M_start + lVar44));
                        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                             (_Bit_type *)
                             &local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish;
                        pcVar6 = (pbVar50->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_1838,pcVar6,pcVar6 + pbVar50->_M_string_length);
                        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage = puVar43;
                        std::
                        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        ::_M_emplace<std::pair<std::__cxx11::string,unsigned_long>>
                                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                    *)local_1720,(string *)&local_1838);
                        if ((_Bit_iterator *)
                            local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                            &local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish) {
                          operator_delete(local_1838.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p);
                        }
                        puVar43 = (_Bit_pointer)((long)puVar43 + 1);
                        lVar44 = lVar44 + 0x20;
                        lVar39 = lVar39 + 0x10;
                      } while ((_Bit_pointer)(lVar17 + (ulong)(lVar17 == 0)) != puVar43);
                    }
                  }
                  std::vector<double,_std::allocator<double>_>::operator=
                            (&peVar41->counts_,&local_17a8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&peVar41->code2entries_,&local_1758);
                  if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1720 != &(peVar41->entry2codes_)._M_h) {
                    std::
                    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    ::
                    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                *)&peVar41->entry2codes_,
                               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)local_1720);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_1720);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_1758);
                  if (local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_17a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((Covec<float> *)local_18c0._0_8_ != (Covec<float> *)0x0) {
                    operator_delete((void *)local_18c0._0_8_);
                  }
                }
                uVar38 = uVar38 + 1;
              } while (uVar38 != uVar42);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"remake data ...",0xf);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
            lVar17 = ((long)local_1878.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1878.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::resize(&local_1878,(long)local_1840 + lVar17);
            std::ios::clear((int)local_1670 +
                            (int)(((element_type *)((long)local_1670 + -0x30))->_M_param)._M_cp.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
            std::istream::seekg((long)local_1670,_S_beg);
            psVar22 = local_17c8.
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              cVar15 = std::ios::widen((char)(((element_type *)((long)local_1670 + -0x30))->_M_param
                                             )._M_cp.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                       (char)(istream *)local_1670);
              piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_1670,(string *)&local_1910,cVar15);
              if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
              local_18e8._0_8_ = lVar17;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1838,uVar42
                         ,(allocator_type *)local_1720);
              lVar17 = 0;
              do {
                uVar38 = std::__cxx11::string::find
                                   ((char)(string *)&local_1910,local_18d0 & 0xffffffff);
                lVar39 = *(long *)((long)&(psVar22->
                                          super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar17 * 2);
                std::__cxx11::string::substr((ulong)local_1720,(ulong)&local_1910);
                cVar26 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)(lVar39 + 0x30),(key_type *)local_1720);
                if (cVar26.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  std::__throw_out_of_range("_Map_base::at");
                  goto LAB_0010ce8c;
                }
                uVar30 = *(undefined8 *)
                          ((long)cVar26.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28);
                if ((undefined1 *)local_1720._0_8_ != local_1720 + 0x10) {
                  operator_delete((void *)local_1720._0_8_);
                }
                *(undefined8 *)
                 ((long)local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar17) =
                     uVar30;
                lVar17 = lVar17 + 8;
              } while (uVar38 < 0xfffffffffffffffe);
              uVar30 = local_18e8._0_8_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (local_1878.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_18e8._0_8_,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1838);
              if ((_Bit_iterator *)
                  local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_iterator *)0x0) {
                operator_delete(local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              }
              lVar17 = uVar30 + 1;
            }
          }
          if (local_1910 !=
              (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
               *)&local_1900) {
            operator_delete(local_1910);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"cannot open file: ",0x12);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,local_17e8,local_17e0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
          std::ostream::put((char)poVar21);
          std::ostream::flush();
        }
        std::ifstream::~ifstream(local_1670);
        if ((_Bit_iterator *)
            local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
          operator_delete(local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_ =
               local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000
          ;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ =
               local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ &
               0xffffffff00000000;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data size: ",0xb);
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"codebook sizes:",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        if (uVar42 != 0) {
          uVar38 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
            poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,": ",2);
            poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
            std::ostream::put((char)poVar21);
            std::ostream::flush();
            uVar38 = uVar38 + 1;
          } while (uVar42 != uVar38);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"creat distributions ...",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        psVar22 = local_17c8.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_1808 = local_17c8.
                     super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        if ((long)local_17c8.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_17c8.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar39 = (long)local_17c8.
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_17c8.
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar49 = 0;
          lVar17 = 0;
          do {
            if ((local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish) ||
               (local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start[lVar17] == uVar49)) {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_1838,true);
              uVar49 = uVar49 + 1;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_1838,false);
            }
            lVar17 = lVar17 + 1;
          } while (lVar39 + (ulong)(lVar39 == 0) != lVar17);
          if (psVar22 != local_1808) {
            uVar42 = 0;
            psVar22 = local_1808;
            do {
              uVar38 = uVar42 + 0x3f;
              if (-1 < (long)uVar42) {
                uVar38 = uVar42;
              }
              if ((*(ulong *)((long)local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (ulong)((uVar42 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar38 >> 6) * 8 + -8) >> (uVar42 & 0x3f) & 1) == 0) {
                std::
                vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                ::push_back((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                             *)&local_17a8,
                            (value_type *)
                            (local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start +
                            local_1858.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar42] * 2));
              }
              else {
                local_1720._0_8_ =
                     (((psVar22->
                       super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->counts_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                     (_Bit_type *)
                     (((psVar22->
                       super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->counts_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                local_1670 = (undefined1  [8])0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<std::discrete_distribution<int>,std::allocator<std::discrete_distribution<int>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                          (&local_1668,(discrete_distribution<int> **)local_1670,
                           (allocator<std::discrete_distribution<int>_> *)&local_1910,
                           (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)local_1720,
                           (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)&local_18a0);
                std::
                vector<std::shared_ptr<std::discrete_distribution<int>>,std::allocator<std::shared_ptr<std::discrete_distribution<int>>>>
                ::emplace_back<std::shared_ptr<std::discrete_distribution<int>>>
                          ((vector<std::shared_ptr<std::discrete_distribution<int>>,std::allocator<std::shared_ptr<std::discrete_distribution<int>>>>
                            *)&local_17a8,(shared_ptr<std::discrete_distribution<int>_> *)local_1670
                          );
                if (local_1668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1668._M_pi);
                }
              }
              uVar42 = uVar42 + 1;
              psVar22 = psVar22 + 1;
            } while (lVar39 + (ulong)(lVar39 == 0) != uVar42);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"initialize covec ...",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        covec::Covec<float>::
        Covec<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  ((Covec<float> *)local_1720,
                   (vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                    *)&local_17a8,
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)local_13b8,local_1800,local_17ec,local_1810,local_17f0,local_17f4,
                   local_1468.enable_chopout,&local_1858);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"start training ...",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        local_1810 = std::chrono::_V2::system_clock::now();
        if (local_18f0 != 0) {
          peVar41 = (element_type *)
                    ((long)&(local_18c8->counts_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start +
                    (ulong)(local_18c8 == (element_type *)0x0));
          local_18d0 = 0;
          sVar40 = 0;
          local_18e8._0_8_ = local_1810;
          local_1840 = peVar41;
          do {
            rVar27 = std::
                     mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                   *)local_13b8);
            srand((uint)rVar27);
            pvVar13 = local_1878.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pvVar12 = local_1878.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_1468.shuffle_enabled == false) {
LAB_0010c29f:
              if ((long)local_1878.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1878.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0010c74a;
              uVar42 = ((long)local_1878.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1878.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              local_1800 = sVar40 + 1;
              uVar38 = 0;
              do {
                uVar24 = uVar38 + 1000000;
                if (uVar24 <= uVar42) {
                  uVar42 = uVar24;
                }
                uVar29 = (uVar42 - uVar38) / (ulong)local_18c8;
                std::vector<std::thread,_std::allocator<std::thread>_>::vector
                          ((vector<std::thread,_std::allocator<std::thread>_> *)local_1670,
                           (size_type)local_18c8,(allocator_type *)&local_18a0);
                peVar32 = (element_type *)0x1;
                lVar17 = 0;
                do {
                  lVar39 = lVar17 * uVar29;
                  if (peVar32 < local_18c8) {
                    local_1910 = (anonymous_namespace)::
                                 run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ;
                    local_18c0._0_8_ = local_1720;
                    local_1758.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_1878.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar38 + lVar39);
                    local_1788._M_current =
                         local_1878.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar38 + (lVar17 + 1) * uVar29;
                    local_1790._M_data =
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13b8;
                    std::thread::
                    thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                              ((thread *)&local_18a0,&local_1910,
                               (reference_wrapper<covec::Covec<float>_> *)local_18c0,
                               (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)&local_1758,&local_1788,&local_1780,&local_1790);
                  }
                  else {
                    local_1910 = (anonymous_namespace)::
                                 run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ;
                    local_18c0._0_8_ = local_1720;
                    local_1758.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_1878.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar38 + lVar39);
                    local_1788._M_current =
                         local_1878.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar42;
                    local_1790._M_data =
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13b8;
                    std::thread::
                    thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                              ((thread *)&local_18a0,&local_1910,
                               (reference_wrapper<covec::Covec<float>_> *)local_18c0,
                               (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)&local_1758,&local_1788,&local_1780,&local_1790);
                  }
                  if (*(long *)((long)local_1670 + (long)peVar32 * 8 + -8) != 0) {
                    std::terminate();
                  }
                  *(_Bit_type **)((long)local_1670 + (long)peVar32 * 8 + -8) =
                       local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  bVar51 = peVar32 != peVar41;
                  peVar32 = (element_type *)
                            ((long)&(peVar32->counts_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + 1);
                  peVar45 = local_1840;
                  lVar17 = lVar17 + 1;
                } while (bVar51);
                do {
                  std::thread::join();
                  peVar45 = (element_type *)
                            ((long)&peVar45[-1].entry2codes_._M_h._M_single_bucket + 7);
                } while (peVar45 != (element_type *)0x0);
                uVar42 = local_18d0 + (uVar42 - uVar38);
                lVar17 = std::chrono::_V2::system_clock::now();
                auVar52._8_4_ = (int)(uVar42 >> 0x20);
                auVar52._0_8_ = uVar42;
                auVar52._12_4_ = 0x45300000;
                dVar54 = auVar52._8_8_ - 1.9342813113834067e+25;
                local_18d0 = uVar42;
                if (999999 < lVar17 - local_18e8._0_8_) {
                  local_18e8._8_4_ = SUB84(dVar54,0);
                  local_18e8._0_8_ =
                       (dVar54 + ((double)CONCAT44(0x43300000,(int)uVar42) - 4503599627370496.0)) *
                       100.0;
                  local_18e8._12_4_ = (int)((ulong)dVar54 >> 0x20);
                  lVar39 = (long)local_1878.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1878.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"epoch ",6);
                  lVar17 = std::cout;
                  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                           *(long *)(std::cout + -0x18)) =
                       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                                *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
                  *(undefined8 *)(std::__cxx11::string::find + *(long *)(lVar17 + -0x18)) = 3;
                  poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"/",1);
                  poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  ",2);
                  lVar39 = local_18f0 * -0x5555555555555555 * (lVar39 >> 3);
                  auVar53._8_4_ = (int)((ulong)lVar39 >> 0x20);
                  auVar53._0_8_ = lVar39;
                  auVar53._12_4_ = 0x45300000;
                  lVar17 = *(long *)poVar21;
                  *(uint *)(poVar21 + *(long *)(lVar17 + -0x18) + 0x18) =
                       *(uint *)(poVar21 + *(long *)(lVar17 + -0x18) + 0x18) & 0xffffff4f | 0x20;
                  *(undefined8 *)(poVar21 + *(long *)(lVar17 + -0x18) + 0x10) = 5;
                  *(uint *)(poVar21 + *(long *)(lVar17 + -0x18) + 0x18) =
                       *(uint *)(poVar21 + *(long *)(lVar17 + -0x18) + 0x18) & 0xfffffefb | 4;
                  *(undefined8 *)(poVar21 + *(long *)(lVar17 + -0x18) + 8) = 2;
                  poVar21 = std::ostream::_M_insert<double>
                                      ((double)local_18e8._0_8_ /
                                       ((auVar53._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar39) -
                                       4503599627370496.0)));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21," %",2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  ",2);
                  lVar17 = *(long *)poVar21;
                  lVar39 = *(long *)(lVar17 + -0x18);
                  *(uint *)(poVar21 + lVar39 + 0x18) =
                       *(uint *)(poVar21 + lVar39 + 0x18) & 0xffffff4f | 0x20;
                  *(undefined8 *)(poVar21 + *(long *)(lVar17 + -0x18) + 0x10) = 6;
                  poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21," words/sec.",0xb);
                  std::ostream::flush();
                  uVar30 = std::chrono::_V2::system_clock::now();
                  local_18e8._0_8_ = uVar30;
                }
                std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                          ((vector<std::thread,_std::allocator<std::thread>_> *)local_1670);
                uVar42 = ((long)local_1878.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1878.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                sVar40 = local_1800;
                uVar38 = uVar24;
              } while (uVar24 < uVar42);
            }
            else {
              if (local_1878.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_1878.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                if (local_1878.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1 !=
                    local_1878.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  lVar17 = 0x18;
                  do {
                    iVar16 = rand();
                    lVar39 = (long)iVar16 % ((lVar17 >> 3) * -0x5555555555555555 + 1);
                    if (lVar17 != lVar39 * 0x18) {
                      pvVar28 = pvVar12 + lVar39;
                      puVar7 = *(pointer *)
                                ((long)&(pvVar12->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar17
                                );
                      puVar2 = (undefined8 *)
                               ((long)&(pvVar12->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar17);
                      puVar9 = (pointer)*puVar2;
                      puVar10 = (pointer)puVar2[1];
                      *(pointer *)
                       ((long)&(pvVar12->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar17) =
                           (pvVar28->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                      puVar11 = (pvVar28->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                      puVar2 = (undefined8 *)
                               ((long)&(pvVar12->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_finish + lVar17);
                      *puVar2 = (pvVar28->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish;
                      puVar2[1] = puVar11;
                      (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start = puVar9;
                      (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish = puVar10;
                      (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar7;
                    }
                    pvVar28 = (pointer)((long)&pvVar12[1].
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar17);
                    lVar17 = lVar17 + 0x18;
                  } while (pvVar28 != pvVar13);
                }
                goto LAB_0010c29f;
              }
LAB_0010c74a:
              sVar40 = sVar40 + 1;
            }
          } while (sVar40 != local_18f0);
        }
        lVar17 = std::chrono::_V2::system_clock::now();
        if (999999 < (long)(lVar17 - local_1810)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"average: ",9);
          lVar17 = std::cout;
          *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                   *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                        *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)(std::__cxx11::string::find + *(long *)(lVar17 + -0x18)) = 6;
          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," words/sec.",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
          std::ostream::put((char)poVar21);
          std::ostream::flush();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"save ...",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        if (local_1720._8_8_ - local_1720._0_8_ != 0) {
          lVar17 = (long)(local_1720._8_8_ - local_1720._0_8_) >> 4;
          local_18e8._0_8_ = _VTT;
          local_18f0 = _memcpy;
          local_1840 = (element_type *)(lVar17 + (ulong)(lVar17 == 0));
          peVar41 = (element_type *)0x0;
          do {
            pCVar46 = (Covec<float> *)(local_18c0 + 0x10);
            local_1910 = (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                          *)&local_1900;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1910,local_1778,local_1778 + local_1770);
            std::__cxx11::string::append((char *)&local_1910);
            cVar15 = '\x01';
            if ((element_type *)0x9 < peVar41) {
              peVar32 = peVar41;
              cVar14 = '\x04';
              do {
                cVar15 = cVar14;
                if (peVar32 < (element_type *)0x64) {
                  cVar15 = cVar15 + -2;
                  goto LAB_0010c9bd;
                }
                if (peVar32 < (element_type *)0x3e8) {
                  cVar15 = cVar15 + -1;
                  goto LAB_0010c9bd;
                }
                if (peVar32 < (element_type *)0x2710) goto LAB_0010c9bd;
                bVar51 = (element_type *)0x1869f < peVar32;
                peVar32 = (element_type *)((ulong)peVar32 / 10000);
                cVar14 = cVar15 + '\x04';
              } while (bVar51);
              cVar15 = cVar15 + '\x01';
            }
LAB_0010c9bd:
            local_18c0._0_8_ = pCVar46;
            std::__cxx11::string::_M_construct((ulong)local_18c0,cVar15);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_18c0._0_8_,local_18c0._8_4_,(unsigned_long)peVar41);
            ppVar37 = (pointer)0xf;
            if (local_1910 !=
                (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                 *)&local_1900) {
              ppVar37 = (pointer)CONCAT71(uStack_18ff,local_1900);
            }
            ppVar3 = (pointer)(CONCAT44(local_18c0._12_4_,local_18c0._8_4_) + local_1908);
            if (ppVar37 < ppVar3) {
              ppVar37 = (pointer)0xf;
              if ((Covec<float> *)local_18c0._0_8_ != pCVar46) {
                ppVar37 = (pointer)local_18c0._16_8_;
              }
              if (ppVar37 < ppVar3) goto LAB_0010ca2a;
              plVar31 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_18c0,0,(char *)0x0,(ulong)local_1910);
            }
            else {
LAB_0010ca2a:
              plVar31 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_1910,local_18c0._0_8_);
            }
            local_1670 = (undefined1  [8])local_1660;
            peVar1 = (element_type *)(plVar31 + 2);
            if ((element_type *)*plVar31 == peVar1) {
              local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (peVar1->_M_param)._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar31[3];
            }
            else {
              local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (peVar1->_M_param)._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_1670 = (undefined1  [8])*plVar31;
            }
            local_1668._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar31[1];
            *plVar31 = (long)peVar1;
            plVar31[1] = 0;
            *(undefined1 *)
             &(peVar1->_M_param)._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start = 0;
            plVar31 = (long *)std::__cxx11::string::append((char *)local_1670);
            local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 &local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish;
            plVar33 = plVar31 + 2;
            if ((_Bit_iterator *)*plVar31 == (_Bit_iterator *)plVar33) {
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar33;
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._8_8_ = plVar31[3];
            }
            else {
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar33;
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar31;
            }
            local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._8_8_ = plVar31[1];
            *plVar31 = (long)plVar33;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            if (local_1670 != (undefined1  [8])local_1660) {
              operator_delete((void *)local_1670);
            }
            if ((Covec<float> *)local_18c0._0_8_ != pCVar46) {
              operator_delete((void *)local_18c0._0_8_);
            }
            if (local_1910 !=
                (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                 *)&local_1900) {
              operator_delete(local_1910);
            }
            std::ofstream::ofstream
                      ((ofstream *)local_1670,
                       (char *)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                       _S_out);
            if (*(int *)((long)&local_1660[0]._M_param._M_prob.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data +
                        (long)((((element_type *)((long)local_1670 + -0x30))->_M_param)._M_cp.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 2)) != 0) goto LAB_0010ce8c;
            peVar8 = local_16b8.
                     super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)peVar41].
                     super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            lVar17 = (long)(peVar8->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar8->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            if (lVar17 != 0) {
              local_18c8 = local_1808[(long)peVar41].
                           super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
              lVar17 = (lVar17 >> 3) * -0x5555555555555555;
              local_18d0 = lVar17 + (ulong)(lVar17 == 0);
              uVar42 = 0;
              do {
                pvVar47 = (peVar8->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar42;
                lVar17 = (long)(local_18c8->code2entries_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1670,*(char **)(lVar17 + uVar42 * 0x20),
                                     *(long *)(lVar17 + uVar42 * 0x20 + 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\t",1);
                std::ostream::_M_insert<double>
                          ((local_18c8->counts_).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar42]);
                lVar17 = (long)*(pointer *)
                                ((long)&pvVar47->super__Vector_base<float,_std::allocator<float>_> +
                                8) -
                         *(long *)&pvVar47->super__Vector_base<float,_std::allocator<float>_>;
                if (lVar17 != 0) {
                  lVar17 = lVar17 >> 2;
                  lVar39 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1670,"\t",1)
                    ;
                    std::ostream::_M_insert<double>
                              ((double)*(float *)(*(long *)&pvVar47->
                                                  super__Vector_base<float,_std::allocator<float>_>
                                                 + lVar39 * 4));
                    lVar39 = lVar39 + 1;
                  } while (lVar17 + (ulong)(lVar17 == 0) != lVar39);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1670,"\n",1);
                uVar42 = uVar42 + 1;
              } while (uVar42 != local_18d0);
            }
            local_1670 = (undefined1  [8])local_18e8._0_8_;
            *(size_t *)
             (local_1670 +
             (long)(((element_type *)(local_18e8._0_8_ + -0x30))->_M_param)._M_cp.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) = local_18f0;
            std::filebuf::~filebuf((filebuf *)&local_1668);
            std::ios_base::~ios_base(local_1578);
            if ((_Bit_iterator *)
                local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                &local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish) {
              operator_delete(local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            }
            peVar41 = (element_type *)
                      ((long)&(peVar41->counts_).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
          } while (peVar41 != local_1840);
        }
        if (local_1688 != (pointer)0x0) {
          operator_delete(local_1688);
        }
        std::
        vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~vector(&local_16a0);
        std::
        vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
        ::~vector(&local_16b8);
        std::
        vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
        ::~vector(&local_16d0);
        if (local_16e8 != (pointer)0x0) {
          operator_delete(local_16e8);
        }
        std::
        vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
        ~vector((vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                 *)local_1720);
        if ((_Bit_iterator *)
            local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
          operator_delete(local_1838.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        std::
        vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
        ::~vector((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                   *)&local_17a8);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_1878);
        std::
        vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ::~vector(&local_17c8);
        if (local_1858.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
          operator_delete(local_1858.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1740 != local_1730) {
          operator_delete(local_1740);
        }
        if (local_1778 != local_1768) {
          operator_delete(local_1778);
        }
        if (local_17e8 != local_17d8) {
          operator_delete(local_17e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1468.share_str._M_dataplus._M_p != &local_1468.share_str.field_2) {
          operator_delete(local_1468.share_str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1468.output_prefix._M_dataplus._M_p != &local_1468.output_prefix.field_2) {
          operator_delete(local_1468.output_prefix._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1468.input_file._M_dataplus._M_p != &local_1468.input_file.field_2) {
          operator_delete(local_1468.input_file._M_dataplus._M_p);
        }
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"empty first line in  input file : ",0x22);
      poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_17e8,local_17e0);
      std::endl<char,std::char_traits<char>>(poVar21);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"cannot read a line from input file : ",0x25);
      poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_17e8,local_17e0);
      std::endl<char,std::char_traits<char>>(poVar21);
    }
  }
  else {
LAB_0010cf23:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"input file cannot open : ",0x19);
    poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_17e8,local_17e0);
    std::endl<char,std::char_traits<char>>(poVar21);
  }
LAB_0010ce76:
  exit(1);
LAB_0010ce8c:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"cannot open output_vector_file: ",0x20);
  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       (char *)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                       local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_);
  std::endl<char,std::char_traits<char>>(poVar21);
  goto LAB_0010ce76;
}

Assistant:

int main(int narg, const char** argv)
{
  const auto& config = parse_args(narg, argv);

  const std::size_t dim = config.dim;
  const std::size_t batch_size = config.batch_size;
  const std::size_t num_epochs = config.num_epochs;
  const std::size_t neg_size = config.neg_size;
  const std::size_t num_threads = config.num_threads;
  const Real sigma = config.sigma;
  const Real eta0 = config.eta0;
  const Real eta1 = config.eta1;
  const bool enable_chopout = config.enable_chopout;
  const std::string input_file = config.input_file;
  const std::string output_prefix = config.output_prefix;
  const char sep = config.sep;
  const std::string share_str = config.share_str;
  const std::vector<std::size_t> share = parse_share_str(share_str);
  const std::size_t order = detect_order(input_file, sep);
  const bool shuffle_enabled = config.shuffle_enabled;
  const bool sort_enabled = config.sort_enabled;

  std::cout << "config:" << std::endl;
  std::cout << "  " <<  "dim          : " << dim << std::endl;
  std::cout << "  " <<  "batch_size   : " << batch_size << std::endl;
  std::cout << "  " <<  "num_epochs   : " << num_epochs << std::endl;
  std::cout << "  " <<  "neg_size     : " << neg_size << std::endl;
  std::cout << "  " <<  "num_threads  : " << num_threads << std::endl;  
  std::cout << "  " <<  "sigma        : " << sigma << std::endl;
  std::cout << "  " <<  "eta0         : " << eta0 << std::endl;
  std::cout << "  " <<  "eta1         : " << eta1 << std::endl;
  std::cout << "  " <<  "input_file   : " << input_file << std::endl;
  std::cout << "  " <<  "output_vector_file  : " << output_prefix + ".<#>.tsv" << std::endl;
  std::cout << "  " <<  "sep          : " << "\"" << sep << "\"" << std::endl;
  
  std::cout << "  " <<  "share        : ";
  for(int i = 0; i < share.size(); ++i){
    if(i > 0){
      std::cout << ",";
    }
    std::cout << share[i];
  }
  std::cout << std::endl;
  
  std::cout << "  " <<  "order        : " << order << std::endl;
  std::cout << "  " <<  "shuffle      : " << std::boolalpha << shuffle_enabled << std::endl;
  std::cout << "  " <<  "sort         : " << std::boolalpha << sort_enabled << std::endl;

  std::vector<std::shared_ptr<CodeBook> > codebooks;
  std::vector<std::vector<std::size_t> > data;
  std::mt19937 gen(0);
  std::cout << "load " << input_file << " ..." << std::endl;;
  load(codebooks, data, input_file, order, sep, sort_enabled, share);
  std::cout << "data size: " << data.size() << std::endl;
  std::cout << "codebook sizes:" << std::endl;
  for(std::size_t i=0; i<order; ++i){
    std::cout << "  " << i << ": " << codebooks[i]->size() << std::endl;
  }

  std::cout << "creat distributions ..." << std::endl;
  std::vector<std::shared_ptr<std::discrete_distribution<int> > > probs;

  std::vector<bool> first_of_sharings;
  std::size_t counter=0;
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(share.empty() || share[i] == counter){
      first_of_sharings.push_back(true);
      ++counter;      
    }else{
      first_of_sharings.push_back(false);
    }
  }
  
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(!first_of_sharings[i]){
      probs.push_back(probs[share[i]]);
    }else{
      probs.push_back( std::make_shared<std::discrete_distribution<int> >
                       (codebooks[i]->counts().begin(), codebooks[i]->counts().end())
                       );
    }
  }
  
  std::cout << "initialize covec ..." << std::endl;
  Covec<Real> cv(probs, gen, dim, sigma, neg_size, eta0, eta1, enable_chopout, share);

  std::cout << "start training ..." << std::endl;
  std::size_t cum_count = 0, every_count = 1000000;
  auto tick = std::chrono::system_clock::now();
  auto start = tick;
  for(std::size_t epoch=0; epoch<num_epochs; ++epoch){
    std::srand(gen());
    if(shuffle_enabled){ std::random_shuffle(data.begin(), data.end()); }

    for(std::size_t m = 0; m < data.size(); m += every_count){

      std::size_t count = std::min(m + every_count, data.size()) - m; // the number of data in this round
      
      std::size_t step = count / num_threads; // data / thread

      // multi thread update
      std::vector<std::thread> threads(num_threads);
      for(std::size_t n=0; n < num_threads; ++n){
        if(n + 1 < num_threads){
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + (n+1) * step,
                                   batch_size,
                                   std::ref(gen));
          assert( m + (n+1) * step <= data.size() );
        }else{
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + count,
                                   batch_size,
                                   std::ref(gen));
          assert( std::min(m + every_count, data.size()) <= data.size() );	  
        }
      }
      for(std::size_t n=0; n < num_threads; ++n){
        threads[n].join();
      }
      
      cum_count += count;
      
      // report
      auto tack = std::chrono::system_clock::now();
      auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - tick).count();
      double percent = (cum_count * 100.0) / (data.size() * num_epochs);
      if(millisec>0){
        std::size_t words_per_sec = (millisec != 0)? (1000*count) / millisec : std::numeric_limits<std::size_t>::max();
        std::cout << "\r"
                  << "epoch " << std::right << std::setw(3) << epoch+1 << "/" << num_epochs
                  << "  " << std::left << std::setw(5) << std::fixed << std::setprecision(2) << percent << " %"
                  << "  " << std::left << std::setw(6) << words_per_sec << " words/sec."
                  << std::flush;
        tick = std::chrono::system_clock::now();
      }
    }
  }

  auto tack = std::chrono::system_clock::now();
  auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - start).count();
  if(millisec > 0){
    std::size_t words_per_sec = (1000 * data.size() * num_epochs) / millisec;
    std::cout << "\r" << "average: " 
              << std::left << std::setw(6)
              << words_per_sec << " words/sec." << std::endl;
  }
  std::cout << std::endl;
  std::cout << "save ..." << std::endl;
  save(output_prefix, cv, codebooks);

  return 0;
}